

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O2

void __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLSamplerCreateReleaseHelper>::SetName
          (GLObjWrapper<GLObjectWrappers::GLSamplerCreateReleaseHelper> *this,GLchar *Name)

{
  PFNGLOBJECTLABELPROC p_Var1;
  size_t sVar2;
  char (*in_RCX) [16];
  GLint GVar3;
  GLuint GVar4;
  string msg;
  
  if (Name == (GLchar *)0x0) {
    Diligent::FormatString<char[26],char[16]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x70e8e1,in_RCX);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
               ,0x7e);
    std::__cxx11::string::~string((string *)&msg);
  }
  GVar4 = this->m_uiHandle;
  if (GVar4 != 0 && __glewObjectLabel != (PFNGLOBJECTLABELPROC)0x0) {
    if (SetName::MaxLabelLen == 0) {
      glGetIntegerv(0x82e8,&SetName::MaxLabelLen);
      glGetError();
      if (SetName::MaxLabelLen < 1) {
        SetName::MaxLabelLen = 0x100;
      }
      SetName::MaxLabelLen = SetName::MaxLabelLen + -1;
      GVar4 = this->m_uiHandle;
    }
    p_Var1 = __glewObjectLabel;
    GVar3 = SetName::MaxLabelLen;
    sVar2 = strlen(Name);
    if ((int)sVar2 <= GVar3) {
      GVar3 = (int)sVar2;
    }
    (*p_Var1)(GLSamplerCreateReleaseHelper::Type,GVar4,GVar3,Name);
    glGetError();
  }
  return;
}

Assistant:

void SetName(const GLchar* Name)
    {
#if GL_KHR_debug
        VERIFY_EXPR(Name != nullptr);
        if (glObjectLabel && m_uiHandle)
        {
            static GLint MaxLabelLen = 0;
            if (MaxLabelLen == 0)
            {
                glGetIntegerv(GL_MAX_LABEL_LENGTH, &MaxLabelLen);
#    ifdef DILIGENT_DEVELOPMENT
                glGetError(); // Ignore GL error
#    endif
                if (MaxLabelLen <= 0)
                {
                    // Minimum required value by the spec
                    MaxLabelLen = 256;
                }

                // The spec requires that the number of characters in <label>,
                // excluding the null terminator, is less than the value of MAX_LABEL_LENGTH.
                // In other words, the maximum length of the label is one less than the value of MAX_LABEL_LENGTH.
                --MaxLabelLen;
            }
            GLsizei Length = static_cast<GLsizei>(strlen(Name));
            if (Length > MaxLabelLen)
                Length = MaxLabelLen;

            glObjectLabel(m_CreateReleaseHelper.Type, m_uiHandle, Length, Name);
#    ifdef DILIGENT_DEVELOPMENT
            glGetError(); // Ignore GL error
#    endif
        }
#endif
    }